

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirOUTPUT(void)

{
  bool bVar1;
  int iVar2;
  int local_38;
  byte local_31;
  int mode;
  char modechar;
  path fnaam;
  
  if (pass != 3) {
    SkipToEol(&lp);
    return;
  }
  GetOutputFileName_abi_cxx11_((path *)&mode,&lp);
  local_31 = 0;
  local_38 = 0;
  bVar1 = comma(&lp);
  if (bVar1) {
    iVar2 = SkipBlanks(&lp);
    if (iVar2 == 0) {
      local_31 = *lp | 0x20;
      lp = lp + 1;
    }
    if (local_31 == 0x61) {
      local_38 = 2;
    }
    else if (local_31 == 0x72) {
      local_38 = 1;
    }
    else {
      if (local_31 != 0x74) {
        Error("[OUTPUT] Invalid <mode> (valid modes: t, a, r)",bp,PASS3);
        goto LAB_00113955;
      }
      local_38 = 0;
    }
  }
  NewDest((path *)&mode,local_38);
LAB_00113955:
  std::filesystem::__cxx11::path::~path((path *)&mode);
  return;
}

Assistant:

static void dirOUTPUT() {
	if (LASTPASS != pass) {
		SkipToEol(lp);
		return;
	}
	const std::filesystem::path fnaam = GetOutputFileName(lp);
	char modechar = 0;
	int mode = OUTPUT_TRUNCATE;
	if (comma(lp)) {
		if (!SkipBlanks(lp)) modechar = (*lp++) | 0x20;
		switch (modechar) {
			case 't': mode = OUTPUT_TRUNCATE;	break;
			case 'r': mode = OUTPUT_REWIND;		break;
			case 'a': mode = OUTPUT_APPEND;		break;
			default:
				Error("[OUTPUT] Invalid <mode> (valid modes: t, a, r)", bp);
				return;
		}
	}
	//Options::NoDestinationFile = false;
	NewDest(fnaam, mode);
}